

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicssceneevent.cpp
# Opt level: O2

void __thiscall
QGraphicsSceneWheelEvent::QGraphicsSceneWheelEvent(QGraphicsSceneWheelEvent *this,Type type)

{
  QGraphicsSceneEventPrivate *dd;
  
  dd = (QGraphicsSceneEventPrivate *)operator_new(0x68);
  dd->widget = (QWidget *)0x0;
  dd->q_ptr = (QGraphicsSceneEvent *)0x0;
  dd->timestamp = 0;
  dd->_vptr_QGraphicsSceneEventPrivate = (_func_int **)&PTR__QGraphicsSceneEventPrivate_007eddf0;
  dd[1]._vptr_QGraphicsSceneEventPrivate = (_func_int **)0x0;
  dd[1].widget = (QWidget *)0x0;
  dd[1].q_ptr = (QGraphicsSceneEvent *)0x0;
  dd[1].timestamp = 0;
  dd[2]._vptr_QGraphicsSceneEventPrivate = (_func_int **)0x0;
  dd[2].widget = (QWidget *)0x0;
  *(undefined8 *)((long)&dd[2].widget + 4) = 0;
  *(undefined8 *)((long)&dd[2].q_ptr + 4) = 0;
  *(undefined8 *)((long)&dd[2].timestamp + 4) = 1;
  *(undefined1 *)((long)&dd[3]._vptr_QGraphicsSceneEventPrivate + 4) = 0;
  QGraphicsSceneEvent::QGraphicsSceneEvent(&this->super_QGraphicsSceneEvent,dd,type);
  *(undefined ***)&this->super_QGraphicsSceneEvent = &PTR__QGraphicsSceneHelpEvent_007edb60;
  return;
}

Assistant:

QGraphicsSceneWheelEvent::QGraphicsSceneWheelEvent(Type type)
    : QGraphicsSceneEvent(*new QGraphicsSceneWheelEventPrivate, type)
{
}